

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type wasm::Type::getLeastUpperBound(Type a,Type b)

{
  Type a_00;
  bool bVar1;
  Exactness exact;
  size_t __n;
  size_t sVar2;
  Type *pTVar3;
  HeapType a_01;
  Nullability nullable;
  optional<wasm::HeapType> oVar4;
  undefined1 auStack_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  Type lub;
  Type a_local;
  Type b_local;
  
  if (a.id == b.id) {
    return (Type)a.id;
  }
  if (a.id == 1) {
    return (Type)b.id;
  }
  if (b.id == 1) {
    return (Type)a.id;
  }
  lub = a;
  a_local = b;
  if ((a.id & 1) != 0 && 6 < a.id) {
    if ((b.id & 1) != 0 && 6 < b.id) {
      __n = size(&lub);
      sVar2 = size(&a_local);
      if (__n == sVar2) {
        auStack_68 = (undefined1  [8])0x0;
        elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,__n);
        sVar2 = 0;
        do {
          if (__n == sVar2) {
            Type(&b_local,(Tuple *)auStack_68);
LAB_00cf99c0:
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68);
            return (Type)b_local.id;
          }
          pTVar3 = operator[](&lub,sVar2);
          a_00.id = pTVar3->id;
          pTVar3 = operator[](&a_local,sVar2);
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)getLeastUpperBound(a_00,(Type)pTVar3->id);
          if (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            b_local.id = 0;
            goto LAB_00cf99c0;
          }
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,
                     (value_type *)
                     &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar2 = sVar2 + 1;
        } while( true );
      }
    }
    return (Type)0;
  }
  if ((a.id & 1) != 0 || a.id < 7) {
    return (Type)0;
  }
  if ((b.id & 1) != 0 || b.id < 7) {
    return (Type)0;
  }
  a_01 = getHeapType(&lub);
  auStack_68 = (undefined1  [8])a_01;
  elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)getHeapType(&a_local);
  oVar4 = HeapType::getLeastUpperBound
                    (a_01,(HeapType)
                          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  if (((undefined1  [16])
       oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    return (Type)0;
  }
  if (lub.id < 7 || ((uint)lub.id & 3) != 2) {
    nullable = (Nullability)(((uint)a_local.id & 3) == 2 && 6 < a_local.id);
  }
  else {
    nullable = Nullable;
  }
  bVar1 = HeapType::isBottom((HeapType *)auStack_68);
  if (bVar1) {
    pTVar3 = &a_local;
  }
  else {
    bVar1 = HeapType::isBottom((HeapType *)
                               &elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar3 = &lub;
    if (!bVar1) {
      bVar1 = isInexact(pTVar3);
      exact = Inexact;
      if ((!bVar1) && (bVar1 = isInexact(&a_local), !bVar1)) {
        exact = (Exactness)
                (auStack_68 ==
                (undefined1  [8])
                elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      }
      goto LAB_00cf9a11;
    }
  }
  exact = getExactness(pTVar3);
LAB_00cf9a11:
  Type(&b_local,oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,nullable,exact);
  return (Type)b_local.id;
}

Assistant:

Type Type::getLeastUpperBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a == Type::unreachable) {
    return b;
  }
  if (b == Type::unreachable) {
    return a;
  }
  if (a.isTuple() && b.isTuple()) {
    auto size = a.size();
    if (size != b.size()) {
      return Type::none;
    }
    std::vector<Type> elems;
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto lub = Type::getLeastUpperBound(a[i], b[i]);
      if (lub == Type::none) {
        return Type::none;
      }
      elems.push_back(lub);
    }
    return Type(elems);
  }
  if (a.isRef() && b.isRef()) {
    auto heapTypeA = a.getHeapType();
    auto heapTypeB = b.getHeapType();
    if (auto heapType = HeapType::getLeastUpperBound(heapTypeA, heapTypeB)) {
      auto nullability =
        (a.isNullable() || b.isNullable()) ? Nullable : NonNullable;
      // If one heap type is bottom, then the exactness comes from the other
      // heap type. Otherwise, the LUB can only be exact if both of the inputs
      // are the same exact heap type.
      auto exactness = heapTypeA.isBottom()               ? b.getExactness()
                       : heapTypeB.isBottom()             ? a.getExactness()
                       : (a.isInexact() || b.isInexact()) ? Inexact
                       : (heapTypeA != heapTypeB)         ? Inexact
                                                          : Exact;
      return Type(*heapType, nullability, exactness);
    }
  }
  return Type::none;
  WASM_UNREACHABLE("unexpected type");
}